

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O2

size_t lzham::lzham_msize(lzham_malloc_context context,void *p)

{
  size_t sVar1;
  
  if (p != (void *)0x0) {
    if (((ulong)p & 0xf) == 0) {
      if (*context != 0x5749abcd) {
        lzham_assert("pContext->m_sig == malloc_context::cSig",
                     "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_mem.cpp"
                     ,0x1b3);
      }
      if (((void *)((long)context + 0x34U) <= p) &&
         (p < (void *)((long)context + (ulong)*(uint *)((long)context + 4) + 0x34))) {
        return (ulong)*(uint *)((long)p + -4);
      }
      sVar1 = (*(code *)g_pMSize)(p,g_pUser_data);
      return sVar1;
    }
    lzham_mem_error("lzham_msize: bad ptr",(char *)p);
  }
  return 0;
}

Assistant:

size_t lzham_msize(lzham_malloc_context context, void* p)
   {
      if (!p)
         return 0;

      if (reinterpret_cast<ptr_bits_t>(p) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1))
      {
         lzham_mem_error(context, "lzham_msize: bad ptr");
         return 0;
      }

      malloc_context *pContext = static_cast<malloc_context *>(context);
      LZHAM_VERIFY(pContext->m_sig == malloc_context::cSig);

      if (pContext->ptr_is_in_arena(p))
      {
         return pContext->arena_msize(p);
      }
      else
      {
         return (*g_pMSize)(p, g_pUser_data);
      }
   }